

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewtFile.c
# Opt level: O1

newtRef NsBaseName(newtRefArg rcvr,newtRefArg r)

{
  char *pcVar1;
  _Bool _Var2;
  uint32_t uVar3;
  void *pvVar4;
  newtRef nVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  
  _Var2 = NewtRefIsString(r);
  if (!_Var2) {
    nVar5 = NewtThrow(-0xbd12,r);
    return nVar5;
  }
  pvVar4 = NewtRefToData(r);
  uVar3 = NewtStringLength(r);
  if (uVar3 == 0) {
    uVar6 = 0;
  }
  else {
    uVar8 = 0;
    uVar7 = 0;
    do {
      pcVar1 = (char *)((long)pvVar4 + uVar8);
      uVar8 = uVar8 + 1;
      if (*pcVar1 == '/') {
        uVar7 = uVar8 & 0xffffffff;
      }
      uVar6 = (uint)uVar7;
    } while (uVar3 != uVar8);
  }
  if (pvVar4 != (void *)0x0 && uVar6 < uVar3) {
    nVar5 = NewtMakeString((char *)((long)pvVar4 + (ulong)uVar6),false);
    return nVar5;
  }
  return r;
}

Assistant:

newtRef NsBaseName(newtRefArg rcvr, newtRefArg r)
{
    char *  base;
    
    if (! NewtRefIsString(r))
        return NewtThrow(kNErrNotAString, r);
    
    base = NewtBaseName(NewtRefToString(r), NewtStringLength(r));
    
    if (base != NULL)
        return NSSTR(base);
    else
        return r;
}